

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::Update
          (RowGroupCollection *this,TransactionData transaction,row_t *ids,
          vector<duckdb::PhysicalIndex,_true> *column_ids,DataChunk *updates)

{
  RowGroup *this_00;
  idx_t iVar1;
  pointer psVar2;
  element_type *peVar3;
  undefined8 ids_00;
  RowGroupSegmentTree *this_01;
  RowGroup *this_02;
  ulong uVar4;
  const_reference pvVar5;
  type stats;
  long lVar6;
  RowGroup *lock;
  long lVar7;
  pointer psVar8;
  pointer psVar9;
  pointer offset;
  undefined1 local_60 [48];
  
  local_60._16_8_ = &this->row_groups;
  this_00 = (RowGroup *)(local_60 + 0x28);
  offset = (pointer)0x0;
  local_60._8_8_ = updates;
  local_60._24_8_ = ids;
  do {
    this_01 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
                        ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)local_60._16_8_);
    ids_00 = local_60._24_8_;
    this_02 = SegmentTree<duckdb::RowGroup,_true>::GetSegment
                        (&this_01->super_SegmentTree<duckdb::RowGroup,_true>,
                         (idx_t)(&(((original *)local_60._24_8_)->
                                  super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)[(long)offset]);
    iVar1 = (this_02->super_SegmentBase<duckdb::RowGroup>).start;
    uVar4 = (long)(&(((original *)ids_00)->
                    super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )[(long)offset] - iVar1 & 0xfffffffffffff800;
    lVar7 = uVar4 + iVar1 + 0x800;
    lVar6 = (this_02->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>.
            _M_i + iVar1;
    if (lVar7 < lVar6) {
      lVar6 = lVar7;
    }
    psVar2 = *(pointer *)
              &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x10))->
               _M_use_count;
    psVar8 = (pointer)((long)&(offset->internal).
                              super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr + 1);
    psVar9 = psVar8;
    if (psVar8 < psVar2) {
      psVar9 = psVar2;
    }
    while (local_60._32_8_ = psVar9, psVar8 < psVar2) {
      peVar3 = (&(((original *)ids_00)->
                 super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               [(long)psVar8];
      local_60._32_8_ = psVar8;
      if (((long)peVar3 < (long)(uVar4 + iVar1)) ||
         (psVar8 = (pointer)((long)&(psVar8->internal).
                                    super___shared_ptr<duckdb::ColumnStatistics,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 1), lVar6 <= (long)peVar3)) break;
    }
    RowGroup::Update(this_02,transaction,(DataChunk *)local_60._8_8_,(row_t *)ids_00,(idx_t)offset,
                     local_60._32_8_ - (long)offset,column_ids);
    TableStatistics::GetLock((TableStatistics *)local_60);
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(column_ids->
                              super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                              ).
                              super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(column_ids->
                              super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                              ).
                              super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
      pvVar5 = vector<duckdb::PhysicalIndex,_true>::get<true>(column_ids,uVar4);
      iVar1 = pvVar5->index;
      unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
      ::operator*((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
                   *)local_60);
      lock = this_02;
      RowGroup::GetStatistics(this_00,(idx_t)this_02);
      stats = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                           *)this_00);
      TableStatistics::MergeStats(&this->stats,(TableStatisticsLock *)lock,iVar1,stats);
      ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                   *)this_00);
    }
    ::std::
    unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>::
    ~unique_ptr((unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
                 *)local_60);
    offset = (pointer)local_60._32_8_;
    if (*(pointer *)
         &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._8_8_ + 0x10))->_M_use_count <=
        (ulong)local_60._32_8_) {
      return;
    }
  } while( true );
}

Assistant:

void RowGroupCollection::Update(TransactionData transaction, row_t *ids, const vector<PhysicalIndex> &column_ids,
                                DataChunk &updates) {
	D_ASSERT(updates.size() >= 1);
	idx_t pos = 0;
	do {
		idx_t start = pos;
		auto row_group = row_groups->GetSegment(UnsafeNumericCast<idx_t>(ids[pos]));
		row_t base_id =
		    UnsafeNumericCast<row_t>(row_group->start + ((UnsafeNumericCast<idx_t>(ids[pos]) - row_group->start) /
		                                                 STANDARD_VECTOR_SIZE * STANDARD_VECTOR_SIZE));
		auto max_id = MinValue<row_t>(base_id + STANDARD_VECTOR_SIZE,
		                              UnsafeNumericCast<row_t>(row_group->start + row_group->count));
		for (pos++; pos < updates.size(); pos++) {
			D_ASSERT(ids[pos] >= 0);
			// check if this id still belongs to this vector in this row group
			if (ids[pos] < base_id) {
				// id is before vector start -> it does not
				break;
			}
			if (ids[pos] >= max_id) {
				// id is after the maximum id in this vector -> it does not
				break;
			}
		}
		row_group->Update(transaction, updates, ids, start, pos - start, column_ids);

		auto l = stats.GetLock();
		for (idx_t i = 0; i < column_ids.size(); i++) {
			auto column_id = column_ids[i];
			stats.MergeStats(*l, column_id.index, *row_group->GetStatistics(column_id.index));
		}
	} while (pos < updates.size());
}